

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

int __thiscall banksia::ChessBoard::toPieceCount(ChessBoard *this,int *pieceCnt)

{
  bool bVar1;
  long lVar2;
  void *in_RSI;
  int type;
  int sd;
  Piece piece;
  int i;
  int totalCnt;
  BoardCore *in_stack_ffffffffffffffc8;
  Piece local_20;
  int local_18;
  int local_14;
  void *local_10;
  
  local_10 = in_RSI;
  if (in_RSI != (void *)0x0) {
    memset(in_RSI,0,0x38);
  }
  local_14 = 0;
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
    local_20 = BoardCore::getPiece(in_stack_ffffffffffffffc8,0);
    bVar1 = Piece::isEmpty(&local_20);
    if (!bVar1) {
      local_14 = local_14 + 1;
      if (local_10 != (void *)0x0) {
        lVar2 = (long)(int)(local_20.side * 7 + local_20.type);
        *(int *)((long)local_10 + lVar2 * 4) = *(int *)((long)local_10 + lVar2 * 4) + 1;
      }
    }
  }
  return local_14;
}

Assistant:

int ChessBoard::toPieceCount(int* pieceCnt) const
{
    if (pieceCnt) {
        memset(pieceCnt, 0, 14 * sizeof(int));
    }
    auto totalCnt = 0;;
    for(int i = 0; i < 64; i++) {
        auto piece = getPiece(i);
        if (piece.isEmpty()) continue;
        totalCnt++;
        auto sd = static_cast<int>(piece.side), type = static_cast<int>(piece.type);
        if (pieceCnt) {
            pieceCnt[sd * 7 + type]++;
        }
    }

    assert(totalCnt >= 2 && totalCnt <= 32);
    return totalCnt;
}